

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

int mwTestNow(char *file,int line,int always_invoked)

{
  mwData *pmVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  mwData **ppmVar9;
  mwData *pmVar10;
  
  if (always_invoked == 0 && file != (char *)0x0) {
    pcVar7 = "chain ";
    if ((mwTestFlags & 1U) == 0) {
      pcVar7 = "";
    }
    pcVar8 = "alloc ";
    if ((mwTestFlags & 2U) == 0) {
      pcVar8 = "";
    }
    pcVar3 = "nomansland ";
    if ((mwTestFlags & 4U) == 0) {
      pcVar3 = "";
    }
    mwWrite("check: <%ld> %s(%d), checking %s%s%s\n",mwCounter,file,line,pcVar7,pcVar8,pcVar3);
  }
  iVar5 = 0;
  if ((mwTestFlags & 1U) != 0) {
    ppmVar9 = &mwHead;
    iVar5 = 0;
LAB_00106638:
    while (pmVar1 = *ppmVar9, pmVar1 != (mwData *)0x0) {
      uVar6 = 0;
      if (mwDataSize != '\0') {
        uVar6 = 0x38;
      }
      iVar2 = mwIsSafeAddr(pmVar1,uVar6);
      if (iVar2 == 0) {
LAB_0010676c:
        if (always_invoked != 0) {
          mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,line);
        }
        mwWrite("check: heap corruption detected\n");
        mwIncErr();
        return iVar5 + 1;
      }
      if (pmVar1->prev != (mwData *)0x0) {
        uVar6 = 0;
        if (mwDataSize != '\0') {
          uVar6 = 0x38;
        }
        iVar2 = mwIsSafeAddr(pmVar1->prev,uVar6);
        if (iVar2 == 0) goto LAB_0010676c;
        if ((pmVar1 == mwHead) || (pmVar1->prev->next != pmVar1)) {
          if (always_invoked != 0) {
            mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,line);
          }
          always_invoked = 0;
          mwWrite("check: heap chain broken, prev link incorrect\n");
          mwIncErr();
          iVar5 = iVar5 + 1;
        }
      }
      ppmVar9 = &pmVar1->next;
      if (pmVar1->next == (mwData *)0x0) goto LAB_00106720;
      uVar6 = 0;
      if (mwDataSize != '\0') {
        uVar6 = 0x38;
      }
      iVar2 = mwIsSafeAddr(pmVar1->next,uVar6);
      if (iVar2 == 0) goto LAB_0010676c;
      if ((pmVar1 == mwTail) || (pmVar1->next->prev != pmVar1)) {
        pcVar7 = "check: heap chain broken, next link incorrect\n";
        goto LAB_00106734;
      }
    }
  }
  if ((mwTestFlags & 2U) != 0) {
    ppmVar9 = &mwHead;
    while (pmVar1 = *ppmVar9, pmVar1 != (mwData *)0x0) {
      iVar2 = mwTestBuf(pmVar1,file,line);
      iVar5 = (iVar5 + 1) - (uint)(iVar2 == 0);
      ppmVar9 = &pmVar1->next;
    }
  }
  if ((mwTestFlags & 4U) != 0) {
    ppmVar9 = &mwHead;
    while (pmVar1 = *ppmVar9, pmVar1 != (mwData *)0x0) {
      if ((pmVar1->flag & 1) != 0) {
        pmVar10 = pmVar1 + 1;
        if (mwDataSize == '\0') {
          pmVar10 = pmVar1;
        }
        pvVar4 = mwTestMem(&pmVar10->next,(uint)pmVar1->size,0xfc);
        if (pvVar4 != (void *)0x0) {
          mwIncErr();
          mwWrite("wild pointer: <%ld> NoMansLand %p alloc\'d at %s(%d)\n",pmVar1->count,
                  &pmVar10->file,pmVar1->file,(ulong)(uint)pmVar1->line);
        }
      }
      ppmVar9 = &pmVar1->next;
    }
  }
  if (((file != (char *)0x0) && (always_invoked == 0)) && (iVar5 == 0)) {
    iVar5 = 0;
    mwWrite("check: <%ld> %s(%d), complete; no errors\n",mwCounter,file,line);
  }
  return iVar5;
LAB_00106720:
  if (pmVar1 != mwTail) {
    pcVar7 = "check: heap chain broken, tail incorrect\n";
LAB_00106734:
    if (always_invoked != 0) {
      mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,line);
    }
    always_invoked = 0;
    mwWrite(pcVar7);
    mwIncErr();
    iVar5 = iVar5 + 1;
  }
  goto LAB_00106638;
}

Assistant:

static int mwTestNow(const char *file, int line, int always_invoked)
{
	int retv = 0;
	mwData *mw;
	char *data;

	if (file && !always_invoked)
		mwWrite("check: <%ld> %s(%d), checking %s%s%s\n",
				mwCounter, file, line,
				(mwTestFlags & MW_TEST_CHAIN) ? "chain " : "",
				(mwTestFlags & MW_TEST_ALLOC) ? "alloc " : "",
				(mwTestFlags & MW_TEST_NML) ? "nomansland " : ""
			   );

	if (mwTestFlags & MW_TEST_CHAIN) {
		for (mw = mwHead; mw; mw = mw->next) {
			if (!mwIsSafeAddr(mw, mwDataSize)) {
				AIPH();
				mwWrite("check: heap corruption detected\n");
				mwIncErr();
				return retv + 1;
			}
			if (mw->prev) {
				if (!mwIsSafeAddr(mw->prev, mwDataSize)) {
					AIPH();
					mwWrite("check: heap corruption detected\n");
					mwIncErr();
					return retv + 1;
				}
				if (mw == mwHead || mw->prev->next != mw) {
					AIPH();
					mwWrite("check: heap chain broken, prev link incorrect\n");
					mwIncErr();
					retv ++;
				}
			}
			if (mw->next) {
				if (!mwIsSafeAddr(mw->next, mwDataSize)) {
					AIPH();
					mwWrite("check: heap corruption detected\n");
					mwIncErr();
					return retv + 1;
				}
				if (mw == mwTail || mw->next->prev != mw) {
					AIPH();
					mwWrite("check: heap chain broken, next link incorrect\n");
					mwIncErr();
					retv ++;
				}
			} else if (mw != mwTail) {
				AIPH();
				mwWrite("check: heap chain broken, tail incorrect\n");
				mwIncErr();
				retv ++;
			}
		}
	}
	if (mwTestFlags & MW_TEST_ALLOC) {
		for (mw = mwHead; mw; mw = mw->next) {
			if (mwTestBuf(mw, file, line)) {
				retv ++;
			}
		}
	}
	if (mwTestFlags & MW_TEST_NML) {
		for (mw = mwHead; mw; mw = mw->next) {
			if ((mw->flag & MW_NML)) {
				data = ((char *)mw) + mwDataSize + mwOverflowZoneSize;
				if (mwTestMem(data, mw->size, MW_VAL_NML)) {
					mwIncErr();
					mwWrite("wild pointer: <%ld> NoMansLand %p alloc'd at %s(%d)\n",
							mw->count, data + mwOverflowZoneSize, mw->file, mw->line);
				}
			}
		}
	}


	if (file && !always_invoked && !retv)
		mwWrite("check: <%ld> %s(%d), complete; no errors\n",
				mwCounter, file, line);
	return retv;
}